

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

qint64 __thiscall QDateTime::toMSecsSinceEpoch(QDateTime *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QFlags<QDateTimePrivate::StatusFlag> flags;
  TimeSpec TVar4;
  QDateTimePrivate *pQVar5;
  Data *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QDateTimePrivate::TransitionOption> in_stack_0000001c;
  TransitionOptions resolve;
  StatusFlags status;
  ZoneState state;
  QDateTimeData *in_stack_ffffffffffffff88;
  QDateTimeData *in_stack_ffffffffffffff90;
  qint64 qVar6;
  QTimeZone *in_stack_ffffffffffffff98;
  undefined1 *local_38;
  QFlagsStorage<QDateTimePrivate::StatusFlag> local_24;
  undefined1 *millis;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24.i = 0xaaaaaaaa;
  local_24.i = (Int)getStatus(in_stack_ffffffffffffff90);
  flags = ::operator|((enum_type)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (enum_type)in_stack_ffffffffffffff90);
  bVar3 = QFlags<QDateTimePrivate::StatusFlag>::testFlags
                    ((QFlags<QDateTimePrivate::StatusFlag> *)&local_24,flags);
  if (bVar3) {
    TVar4 = extractSpec((QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)
                        SUB84((ulong)in_stack_ffffffffffffff88 >> 0x20,0));
    switch(TVar4) {
    case LocalTime:
      bVar3 = QFlags<QDateTimePrivate::StatusFlag>::testFlag
                        ((QFlags<QDateTimePrivate::StatusFlag> *)&in_stack_ffffffffffffff90->data,
                         (StatusFlag)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      if (bVar3) {
        getStatus(in_stack_ffffffffffffff90);
        extractDaylightStatus
                  ((QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)
                   SUB84((ulong)in_stack_ffffffffffffff88 >> 0x20,0));
        toTransitionOptions(0x56f3f3);
        millis = &DAT_aaaaaaaaaaaaaaaa;
        getMSecs(in_stack_ffffffffffffff88);
        QDateTimePrivate::localStateAtMillis((qint64)millis,(TransitionOptions)in_stack_0000001c.i);
        local_38 = millis + 0x14d555557f0;
      }
      else {
        pQVar5 = Data::operator->(in_RDI);
        qVar6 = pQVar5->m_msecs;
        pQVar5 = Data::operator->(in_RDI);
        local_38 = (undefined1 *)(qVar6 + (long)pQVar5->m_offsetFromUtc * -1000);
      }
      break;
    case UTC:
      local_38 = (undefined1 *)getMSecs(in_stack_ffffffffffffff88);
      break;
    case OffsetFromUTC:
      pQVar5 = Data::operator->(in_RDI);
      lVar2 = pQVar5->m_msecs;
      pQVar5 = Data::operator->(in_RDI);
      local_38 = (undefined1 *)(lVar2 + (long)pQVar5->m_offsetFromUtc * -1000);
      break;
    case TimeZone:
      Data::operator->(in_RDI);
      bVar3 = QTimeZone::isValid(in_stack_ffffffffffffff98);
      if (bVar3) {
        pQVar5 = Data::operator->(in_RDI);
        qVar6 = pQVar5->m_msecs;
        pQVar5 = Data::operator->(in_RDI);
        local_38 = (undefined1 *)(qVar6 + (long)pQVar5->m_offsetFromUtc * -1000);
      }
      else {
        local_38 = (undefined1 *)0x0;
      }
    }
  }
  else {
    local_38 = (undefined1 *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (qint64)local_38;
}

Assistant:

qint64 QDateTime::toMSecsSinceEpoch() const
{
    // Note: QDateTimeParser relies on this producing a useful result, even when
    // !isValid(), at least when the invalidity is a time in a fall-back (that
    // we'll have adjusted to lie outside it, but marked invalid because it's
    // not what was asked for). Other things may be doing similar. But that's
    // only relevant when we got enough data for resolution to find it invalid.
    const auto status = getStatus(d);
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime))
        return 0;

    switch (extractSpec(status)) {
    case Qt::UTC:
        return getMSecs(d);

    case Qt::OffsetFromUTC:
        Q_ASSERT(!d.isShort());
        return d->m_msecs - d->m_offsetFromUtc * MSECS_PER_SEC;

    case Qt::LocalTime:
        if (status.testFlag(QDateTimePrivate::ShortData)) {
            // Short form has nowhere to cache the offset, so recompute.
            const auto resolve = toTransitionOptions(extractDaylightStatus(getStatus(d)));
            const auto state = QDateTimePrivate::localStateAtMillis(getMSecs(d), resolve);
            return state.when - state.offset * MSECS_PER_SEC;
        }
        // Use the offset saved by refreshZonedDateTime() on creation.
        return d->m_msecs - d->m_offsetFromUtc * MSECS_PER_SEC;

    case Qt::TimeZone:
        Q_ASSERT(!d.isShort());
#if QT_CONFIG(timezone)
        // Use offset refreshZonedDateTime() saved on creation:
        if (d->m_timeZone.isValid())
            return d->m_msecs - d->m_offsetFromUtc * MSECS_PER_SEC;
#endif
        return 0;
    }
    Q_UNREACHABLE_RETURN(0);
}